

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageExists
          (BaseCase *this,MessageData *message,GLenum source,GLenum type)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_390;
  allocator<char> local_209;
  string local_208;
  MessageBuilder local_1e8;
  allocator<char> local_51;
  string local_50;
  TestLog *local_30;
  TestLog *log;
  GLenum type_local;
  GLenum source_local;
  MessageData *message_local;
  BaseCase *this_local;
  
  log._0_4_ = type;
  log._4_4_ = source;
  _type_local = message;
  message_local = (MessageData *)this;
  local_30 = tcu::TestContext::getLog
                       ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  if ((log._4_4_ == 0x1100) || ((GLenum)log == 0x1100)) {
    this_local._7_1_ = false;
  }
  else if (((_type_local->id).source == 0) || ((_type_local->id).type == 0)) {
    bVar1 = isDebugContext(this);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Message was not reported as expected",&local_51);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      tcu::TestLog::operator<<(&local_1e8,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_1e8,(char (*) [45])"A message was expected but none was reported");
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Verification accuracy is lacking without a debug context",
                 &local_209);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      tcu::TestLog::operator<<(&local_390,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_390,
                          (char (*) [78])
                          "A message was expected but none was reported. Running without a debug context"
                         );
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_390);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BaseCase::verifyMessageExists (const MessageData& message, GLenum source, GLenum type)
{
	TestLog& log = m_testCtx.getLog();

	if (source == GL_DONT_CARE || type == GL_DONT_CARE)
		return false;
	else if (message.id.source == GL_NONE || message.id.type == GL_NONE)
	{
		if (isDebugContext())
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message was not reported as expected");
			log << TestLog::Message << "A message was expected but none was reported" << TestLog::EndMessage;
		}
		else
		{
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
			log << TestLog::Message << "A message was expected but none was reported. Running without a debug context" << TestLog::EndMessage;
		}
		return false;
	}
	else
		return true;
}